

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediumAsteroid.cpp
# Opt level: O2

void __thiscall MediumAsteroid::spawn(MediumAsteroid *this)

{
  Asteroid *this_00;
  EVP_PKEY_CTX *in_RSI;
  int iVar1;
  bool bVar2;
  Asteroid *local_70;
  float local_68;
  float local_58;
  float local_48;
  
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_48 = randf(0.06,0.12);
    local_58 = randf(0.04,0.08);
    local_68 = randf(0.001,0.005);
    rand();
    rand();
    rand();
    this_00 = (Asteroid *)operator_new(0x50);
    SmallAsteroid::SmallAsteroid((SmallAsteroid *)this_00);
    Asteroid::init(this_00,in_RSI);
    in_RSI = (EVP_PKEY_CTX *)&local_70;
    local_70 = this_00;
    std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
              (&new_entities_abi_cxx11_,(value_type *)in_RSI);
  }
  Entity::spawn((Entity *)this);
  return;
}

Assistant:

void MediumAsteroid::spawn(void)
{
   // Break into small fragments
   for (int i = 0; i < 3; i++) {
      float dx = randf(0.06f, 0.12f);
      float dy = randf(0.04f, 0.08f);
      float da = randf(0.001, 0.005);
      if (rand() % 2) dx = -dx;
      if (rand() % 2) dy = -dy;
      if (rand() % 2) da = -da;
      SmallAsteroid *sa = new SmallAsteroid();
      sa->init(x, y, dx, dy, da);
      new_entities.push_back(sa);
   }

   Entity::spawn();
}